

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.cpp
# Opt level: O3

void testReadBadArgs(string *tempdir)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  size_t sVar4;
  undefined8 extraout_RAX;
  char *in_RCX;
  exr_context_t f;
  string fn;
  undefined1 local_b0 [8];
  undefined1 *local_a8;
  undefined8 local_a0;
  undefined1 local_98;
  undefined7 uStack_97;
  undefined8 local_88;
  code *local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  local_a0 = 0;
  local_98 = 0;
  local_38 = 0;
  local_28 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0x68;
  uStack_30 = 0xbf800000fffffffe;
  local_80 = err_cb;
  local_a8 = &local_98;
  exr_set_default_memory_routines(failable_malloc,failable_free);
  std::__cxx11::string::_M_assign((string *)&local_a8);
  iVar1 = exr_start_read(0,local_a8,0);
  if (iVar1 == 3) {
    iVar1 = exr_start_read(local_b0,0,0);
    if (iVar1 != 3) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar3 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar3 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar4 = strlen(pcVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar3 = (char *)exr_get_default_error_message(3);
      if (pcVar3 != (char *)0x0) goto LAB_0014192b;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00141941;
    }
    iVar1 = exr_start_read(local_b0,0,&local_88);
    if (iVar1 != 3) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar3 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar3 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar4 = strlen(pcVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar3 = (char *)exr_get_default_error_message(3);
      if (pcVar3 != (char *)0x0) goto LAB_00141980;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00141996;
    }
    iVar1 = exr_start_read(local_b0,"",&local_88);
    if (iVar1 != 5) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar3 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar3 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar4 = strlen(pcVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar3 = (char *)exr_get_default_error_message(5);
      if (pcVar3 != (char *)0x0) goto LAB_001419d5;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_001419eb;
    }
    iVar1 = exr_start_read(local_b0,local_a8,&local_88);
    if (iVar1 != 10) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar3 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar3 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar4 = strlen(pcVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar3 = (char *)exr_get_default_error_message(10);
      if (pcVar3 != (char *)0x0) goto LAB_00141a2a;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00141a40;
    }
    std::__cxx11::string::append((char *)&local_a8);
    iVar1 = exr_start_read(local_b0,local_a8,&local_88);
    if (iVar1 != 5) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar3 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar3 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar4 = strlen(pcVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar3 = (char *)exr_get_default_error_message(5);
      if (pcVar3 != (char *)0x0) goto LAB_00141a7f;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00141a95;
    }
    s_malloc_fail_on = 1;
    iVar1 = exr_start_read(local_b0,local_a8,&local_88);
    s_malloc_fail_on = 0;
    if (iVar1 == 1) {
      exr_set_default_memory_routines(0,0);
      if (local_a8 != &local_98) {
        operator_delete(local_a8,CONCAT71(uStack_97,local_98) + 1);
      }
      return;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar3 = (char *)exr_get_default_error_message(iVar1);
    if (pcVar3 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar4 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar3 = (char *)exr_get_default_error_message(1);
    if (pcVar3 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00141aea;
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar3 = (char *)exr_get_default_error_message(iVar1);
    if (pcVar3 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar4 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar3 = (char *)exr_get_default_error_message(3);
    if (pcVar3 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar4 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_start_read (__null, fn.c_str (), __null)",(char *)0x4c,0x34adc9,in_RCX);
LAB_0014192b:
    sVar4 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
LAB_00141941:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_start_read (&f, __null, __null)",(char *)0x4e,0x34adc9,in_RCX);
LAB_00141980:
    sVar4 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
LAB_00141996:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_start_read (&f, __null, &cinit)",(char *)0x50,0x34adc9,in_RCX);
LAB_001419d5:
    sVar4 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
LAB_001419eb:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_start_read (&f, \"\", &cinit)",(char *)0x52,0x34adc9,in_RCX);
LAB_00141a2a:
    sVar4 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
LAB_00141a40:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_start_read (&f, fn.c_str (), &cinit)",(char *)0x5a,0x34adc9,in_RCX);
LAB_00141a7f:
    sVar4 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
LAB_00141a95:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_start_read (&f, fn.c_str (), &cinit)",(char *)0x5e,0x34adc9,in_RCX);
  }
  sVar4 = strlen(pcVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
LAB_00141aea:
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  core_test_fail("exr_start_read (&f, fn.c_str (), &cinit)",(char *)0x60,0x34adc9,in_RCX);
  if (local_a8 != &local_98) {
    operator_delete(local_a8,CONCAT71(uStack_97,local_98) + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void
testReadBadArgs (const std::string& tempdir)
{
    exr_context_t             f;
    std::string               fn;
    exr_context_initializer_t cinit = EXR_DEFAULT_CONTEXT_INITIALIZER;
    cinit.error_handler_fn          = &err_cb;

    exr_set_default_memory_routines (&failable_malloc, &failable_free);
    fn = tempdir;
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT, exr_start_read (NULL, fn.c_str (), NULL));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT, exr_start_read (&f, NULL, NULL));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT, exr_start_read (&f, NULL, &cinit));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_FILE_ACCESS, exr_start_read (&f, "", &cinit));
    // windows fails on directory open, where under unix you can open
    // the directory as a file handle but not read from it
#ifdef _WIN32
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_FILE_ACCESS, exr_start_read (&f, fn.c_str (), &cinit));
#else
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_READ_IO, exr_start_read (&f, fn.c_str (), &cinit));
#endif
    fn.append ("invalid.exr");
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_FILE_ACCESS, exr_start_read (&f, fn.c_str (), &cinit));
    EXRCORE_TEST_RVAL_FAIL_MALLOC (
        EXR_ERR_OUT_OF_MEMORY, exr_start_read (&f, fn.c_str (), &cinit));

    exr_set_default_memory_routines (NULL, NULL);
}